

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv4Transmitter::SetReceiveMode(RTPUDPv4Transmitter *this,ReceiveMode m)

{
  HashElement *pHVar1;
  RTPMemoryManager *pRVar2;
  HashElement *pHVar3;
  int iVar4;
  
  iVar4 = -0x5a;
  if (((this->init == true) && (iVar4 = -0x59, this->created == true)) &&
     (iVar4 = 0, this->receivemode != m)) {
    this->receivemode = m;
    iVar4 = 0;
    memset((this->acceptignoreinfo).table,0,0x103e8);
    pHVar3 = (this->acceptignoreinfo).firsthashelem;
    while (pHVar3 != (HashElement *)0x0) {
      pHVar1 = pHVar3->listnext;
      pRVar2 = (this->acceptignoreinfo).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        operator_delete(pHVar3,0x30);
        pHVar3 = pHVar1;
      }
      else {
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pHVar3);
        pHVar3 = pHVar1;
      }
    }
    (this->acceptignoreinfo).firsthashelem = (HashElement *)0x0;
    (this->acceptignoreinfo).lasthashelem = (HashElement *)0x0;
  }
  return iVar4;
}

Assistant:

int RTPUDPv4Transmitter::SetReceiveMode(RTPTransmitter::ReceiveMode m)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (m != receivemode)
	{
		receivemode = m;
		acceptignoreinfo.Clear();
	}
	MAINMUTEX_UNLOCK
	return 0;
}